

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O0

void nn_ctcp_start_resolving(nn_ctcp *self)

{
  char *pcVar1;
  size_t local_38;
  size_t ipv4onlylen;
  char *pcStack_28;
  int ipv4only;
  char *end;
  char *begin;
  char *addr;
  nn_ctcp *self_local;
  
  addr = (char *)self;
  begin = nn_epbase_getaddr(&self->epbase);
  pcVar1 = strchr(begin,0x3b);
  if (pcVar1 == (char *)0x0) {
    end = begin;
  }
  else {
    end = pcVar1 + 1;
  }
  pcStack_28 = strrchr(begin,0x3a);
  if (pcStack_28 == (char *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","end",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/ctcp.c"
            ,0x20b);
    fflush(_stderr);
    nn_err_abort();
  }
  local_38 = 4;
  nn_epbase_getopt((nn_epbase *)(addr + 0x60),0,0xe,(void *)((long)&ipv4onlylen + 4),&local_38);
  if (local_38 != 4) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ipv4onlylen == sizeof (ipv4only)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/ctcp.c"
            ,0x211);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_dns_start((nn_dns *)(addr + 0x7c8),end,(long)pcStack_28 - (long)end,ipv4onlylen._4_4_,
               (nn_dns_result *)(addr + 0x940));
  addr[0x58] = '\x02';
  addr[0x59] = '\0';
  addr[0x5a] = '\0';
  addr[0x5b] = '\0';
  return;
}

Assistant:

static void nn_ctcp_start_resolving (struct nn_ctcp *self)
{
    const char *addr;
    const char *begin;
    const char *end;
    int ipv4only;
    size_t ipv4onlylen;

    /*  Extract the hostname part from address string. */
    addr = nn_epbase_getaddr (&self->epbase);
    begin = strchr (addr, ';');
    if (!begin)
        begin = addr;
    else
        ++begin;
    end = strrchr (addr, ':');
    nn_assert (end);

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  TODO: Get the actual value of IPV4ONLY option. */
    nn_dns_start (&self->dns, begin, end - begin, ipv4only, &self->dns_result);

    self->state = NN_CTCP_STATE_RESOLVING;
}